

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemapping.cpp
# Opt level: O3

bool __thiscall myutils::FileMapping::create_shmem(FileMapping *this,string *name,uint32_t filesize)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  
  std::__cxx11::string::_M_assign((string *)&this->m_id);
  __fd = shm_open((name->_M_dataplus)._M_p,0xc2,0x1b6);
  if (__fd != -1) {
    iVar1 = ftruncate(__fd,(ulong)filesize);
    if ((iVar1 == 0) &&
       (pcVar2 = (char *)mmap((void *)0x0,(ulong)filesize,3,1,__fd,0),
       pcVar2 != (char *)0xffffffffffffffff)) {
      this->m_pMapAddress = pcVar2;
      this->m_fd = __fd;
      this->m_filesize = filesize;
      return true;
    }
    ::close(__fd);
    shm_unlink((name->_M_dataplus)._M_p);
  }
  return false;
}

Assistant:

bool FileMapping::create_shmem (const string& name, uint32_t filesize)
{
    // std::cout <<"create_shmem: " << name << "," << filesize << endl;

    m_id = name;

#ifdef __FreeBSD__
    std::stringstream ss;
    ss << "/" << name;
    string shmem_path = ss.str();
#else
    const string& shmem_path = name;
#endif

    int fd = shm_open(shmem_path.c_str(), O_CREAT | O_EXCL | O_RDWR, 0666);
    if (fd == -1) {
        // std::cout << "shm_open error: " << name << "," << strerror(errno) << "\n";
        return false;
    }

    int ret = ftruncate(fd, filesize);
    if (ret) {
        // std::cout << "ftruncat error: " << strerror(errno) << endl;
        ::close(fd);
        shm_unlink(name.c_str());
        return false;
    }

    int proto = PROT_READ | PROT_WRITE;
    char * p  = (char*)mmap(nullptr, filesize, proto, MAP_SHARED, fd, 0);
    if (p != MAP_FAILED) {
        m_pMapAddress = p;
        m_fd = fd;
        m_filesize = filesize;
        //shm_unlink(name.c_str());
        return true;
    } else {
        // std::cout << "mmap error: " << fd <<"," << strerror(errno) << endl;
        ::close(fd);
        shm_unlink(name.c_str());
        return false;
    }
}